

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathEuler.h
# Opt level: O1

void __thiscall Imath_3_2::Euler<float>::extract(Euler<float> *this,Matrix33<float> *M)

{
  undefined8 uVar1;
  undefined8 uVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  float fVar10;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float local_168 [4];
  float local_158 [8];
  undefined8 uStack_138;
  float local_130;
  undefined8 local_12c;
  undefined8 uStack_124;
  float local_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  bVar3 = this->field_0xc;
  uVar7 = bVar3 >> 3 & 3;
  if ((bVar3 & 4) == 0) {
    uVar4 = 2;
    if ((char)uVar7 != '\0') {
      uVar4 = uVar7 - 1;
    }
  }
  else {
    uVar4 = (uVar7 + 1) % 3;
  }
  if ((bVar3 & 4) == 0) {
    uVar5 = (uVar7 + 1) % 3;
  }
  else {
    uVar5 = 2;
    if ((char)uVar7 != '\0') {
      uVar5 = uVar7 - 1;
    }
  }
  lVar9 = (long)(int)uVar4;
  if ((bVar3 & 2) == 0) {
    lVar8 = (long)(int)uVar5;
    fVar10 = atan2f(M->x[lVar9][lVar8],*(float *)((long)M->x + lVar8 * 0x10));
    (this->super_Vec3<float>).x = fVar10;
    local_168[0] = 0.0;
    local_168[1] = 0.0;
    local_168[2] = 0.0;
    if ((this->field_0xc & 4) != 0) {
      fVar10 = -fVar10;
    }
    *(float *)((long)local_168 + (ulong)(uVar7 * 4)) = fVar10;
    local_158[0] = 1.0;
    local_158[1] = 0.0;
    local_158[2] = 0.0;
    local_158[3] = 0.0;
    local_158[4] = 0.0;
    local_158[5] = 1.0;
    local_158[6] = 0.0;
    local_158[7] = 0.0;
    uStack_138 = 0;
    local_130 = 1.0;
    local_12c = 0;
    uStack_124 = 0;
    local_11c = 1.0;
    local_108 = local_168[2];
    local_118 = cosf(local_168[2]);
    local_d8 = local_168[1];
    local_b8 = cosf(local_168[1]);
    local_e8 = local_168[0];
    uStack_b4 = extraout_XMM0_Db;
    uStack_b0 = extraout_XMM0_Dc;
    uStack_ac = extraout_XMM0_Dd;
    local_c8 = cosf(local_168[0]);
    local_108 = sinf(local_108);
    uStack_104 = extraout_XMM0_Db_00;
    uStack_100 = extraout_XMM0_Dc_00;
    uStack_fc = extraout_XMM0_Dd_00;
    local_f8 = sinf(local_d8);
    fVar10 = sinf(local_e8);
    fVar11 = local_158[1];
    fVar19 = local_118 * local_b8;
    fVar13 = local_b8 * local_108;
    fVar12 = local_118 * local_f8 * fVar10 - local_108 * local_c8;
    fVar15 = local_118 * local_c8 + local_108 * local_f8 * fVar10;
    fVar24 = local_b8 * fVar10;
    fVar17 = local_108 * fVar10 + local_c8 * local_118 * local_f8;
    local_78 = local_c8 * local_108 * local_f8 - local_118 * fVar10;
    local_b8 = local_b8 * local_c8;
    fVar20 = (fVar19 * local_158[0] + fVar13 * local_158[4]) - local_f8 * (float)uStack_138;
    fVar21 = (fVar19 * local_158[1] + fVar13 * local_158[5]) - local_f8 * uStack_138._4_4_;
    fVar22 = (fVar19 * local_158[2] + fVar13 * local_158[6]) - local_f8 * local_130;
    fStack_e4 = (fVar19 * local_158[3] + fVar13 * local_158[7]) - local_f8 * (float)local_12c;
    local_c8 = (float)uStack_138;
    fStack_c4 = uStack_138._4_4_;
    fStack_c0 = local_130;
    fStack_bc = (float)local_12c;
    fVar25 = fVar24 * (float)uStack_138 + fVar12 * local_158[0] + fVar15 * local_158[4];
    local_a8 = fVar24 * uStack_138._4_4_ + fVar12 * local_158[1] + fVar15 * local_158[5];
    fVar26 = fVar24 * local_130 + fVar12 * local_158[2] + fVar15 * local_158[6];
    fStack_54 = fVar24 * (float)local_12c + fVar12 * local_158[3] + fVar15 * local_158[7];
    local_108 = fVar17;
    local_d8 = local_158[0];
    fStack_d4 = local_158[1];
    fStack_d0 = local_158[2];
    fStack_cc = local_158[3];
    fVar14 = local_b8 * (float)uStack_138 + fVar17 * local_158[0] + local_78 * local_158[4];
    local_88 = local_b8 * uStack_138._4_4_ + fVar17 * local_158[1] + local_78 * local_158[5];
    fVar16 = local_130 * local_b8 + local_158[2] * fVar17 + local_158[6] * local_78;
    local_78 = local_158[7] * local_78;
    fStack_74 = local_158[7];
    fStack_70 = local_158[7];
    fStack_6c = local_158[7];
    fVar10 = M->x[0][2];
    fVar12 = M->x[1][2];
    fVar13 = M->x[2][2];
    local_e8 = fStack_e4 * 0.0 + fVar22 * fVar13 + fVar20 * fVar10 + fVar21 * fVar12;
    fStack_e0 = fStack_e4;
    fStack_dc = fStack_e4;
    fStack_a4 = local_a8;
    fStack_a0 = local_a8;
    fStack_9c = local_a8;
    local_68 = ZEXT416((uint)fVar13);
    local_58 = fStack_54 * 0.0 + fVar26 * fVar13 + fVar25 * fVar10 + local_a8 * fVar12;
    fStack_50 = fStack_54;
    fStack_4c = fStack_54;
    fStack_84 = local_88;
    fStack_80 = local_88;
    fStack_7c = local_88;
    local_f8 = fVar16 * fVar13 + fVar10 * fVar14 + fVar12 * local_88;
    fStack_f4 = (float)local_12c;
    fStack_f0 = local_130;
    fStack_ec = (float)local_12c;
    local_48 = fVar16 * 0.0 + fVar14 * 0.0 + local_88 * 0.0;
    fStack_44 = (float)local_12c;
    fStack_40 = local_130;
    fStack_3c = (float)local_12c;
    fVar18 = (float)uStack_124 * 0.0;
    fVar27 = local_12c._4_4_ * 0.0;
    fVar23 = uStack_124._4_4_ * 0.0;
    uVar1 = *(undefined8 *)M->x[1];
    fVar28 = (float)uVar1;
    fVar30 = (float)((ulong)uVar1 >> 0x20);
    uVar1 = *(undefined8 *)M->x[0];
    fVar10 = (float)uVar1;
    fVar15 = (float)((ulong)uVar1 >> 0x20);
    local_98 = *(undefined8 *)M->x[2];
    fVar19 = (float)local_98;
    fVar24 = (float)((ulong)local_98 >> 0x20);
    uStack_90 = 0;
    local_118 = fStack_e4 * 0.0 + fVar22 * fVar19 + fVar20 * fVar10 + fVar21 * fVar28;
    fStack_114 = fStack_e4 * 0.0 + fVar22 * fVar24 + fVar20 * fVar15 + fVar21 * fVar30;
    fStack_110 = fStack_e4 * 0.0 + fStack_e4 * 0.0 + fVar21 * 0.0 + fVar21 * 0.0;
    fStack_10c = fStack_e4 * 0.0 + fStack_e4 * 0.0 + fVar21 * 0.0 + fVar21 * 0.0;
    fVar29 = fVar28 * (float)uStack_124;
    uVar1 = *(undefined8 *)(M->x[1] + 1);
    uVar2 = *(undefined8 *)(M->x[0] + 1);
    local_158[0] = local_118;
    local_158[1] = fStack_114;
    local_158[2] = local_e8;
    local_158[3] = fVar22 * 0.0 + fVar20 * 0.0 + fVar21 * 0.0 + fStack_e4;
    local_158[4] = fStack_54 * 0.0 + fVar26 * fVar19 + fVar25 * fVar10 + local_a8 * fVar28;
    local_158[5] = fStack_54 * 0.0 + fVar26 * fVar24 + fVar25 * fVar15 + local_a8 * fVar30;
    local_158[7] = fVar26 * 0.0 + fVar25 * 0.0 + local_a8 * 0.0 + fStack_54;
    local_158[6] = local_58;
    fVar20 = fVar19 * uStack_124._4_4_;
    fVar11 = local_b8 * uStack_138._4_4_ + fVar17 * fVar11 + local_78;
    fVar12 = fVar11 * 0.0;
    uStack_138 = CONCAT44(fVar12 + fVar16 * fVar24 + fVar14 * fVar15 + local_88 * fVar30,
                          fVar12 + fVar16 * fVar19 + fVar14 * fVar10 + local_88 * fVar28);
    local_130 = local_f8 + fVar12;
    uStack_124 = CONCAT44(local_11c * 0.0 +
                          fVar13 * uStack_124._4_4_ +
                          local_12c._4_4_ * (float)((ulong)uVar2 >> 0x20) +
                          (float)uStack_124 * (float)((ulong)uVar1 >> 0x20),
                          local_11c * 0.0 +
                          fVar24 * uStack_124._4_4_ +
                          local_12c._4_4_ * (float)uVar2 + (float)uStack_124 * (float)uVar1);
    local_12c = CONCAT44(local_11c * 0.0 + fVar20 + local_12c._4_4_ * fVar10 + fVar29,
                         local_48 + fVar11);
    local_11c = fVar23 + fVar27 + fVar18 + local_11c;
    uVar4 = uVar7 << 4;
    fVar10 = *(float *)((long)local_158 + (ulong)(uVar7 * 4) + (ulong)uVar4);
    fVar12 = *(float *)((long)local_158 + lVar9 * 4 + (ulong)uVar4);
    fVar10 = fVar10 * fVar10 + fVar12 * fVar12;
    if (fVar10 < 0.0) {
      fVar10 = sqrtf(fVar10);
    }
    else {
      fVar10 = SQRT(fVar10);
    }
    fVar10 = atan2f(-*(float *)((long)local_158 + lVar8 * 4 + (ulong)uVar4),fVar10);
    (this->super_Vec3<float>).y = fVar10;
    fVar12 = -local_158[lVar9 * 4 + (ulong)uVar7];
    fVar10 = local_158[lVar9 * 5];
  }
  else {
    uVar6 = (ulong)(uVar7 * 4);
    lVar8 = (long)(int)uVar5;
    fVar10 = atan2f(*(float *)((long)M->x[lVar9] + uVar6),*(float *)((long)M->x[lVar8] + uVar6));
    (this->super_Vec3<float>).x = fVar10;
    local_168[0] = 0.0;
    local_168[1] = 0.0;
    local_168[2] = 0.0;
    if ((this->field_0xc & 4) != 0) {
      fVar10 = -fVar10;
    }
    *(float *)((long)local_168 + uVar6) = fVar10;
    local_158[0] = 1.0;
    local_158[1] = 0.0;
    local_158[2] = 0.0;
    local_158[3] = 0.0;
    local_158[4] = 0.0;
    local_158[5] = 1.0;
    local_158[6] = 0.0;
    local_158[7] = 0.0;
    uStack_138 = 0;
    local_130 = 1.0;
    local_12c = 0;
    uStack_124 = 0;
    local_11c = 1.0;
    local_108 = local_168[2];
    local_118 = cosf(local_168[2]);
    local_d8 = local_168[1];
    local_b8 = cosf(local_168[1]);
    local_e8 = local_168[0];
    uStack_b4 = extraout_XMM0_Db_01;
    uStack_b0 = extraout_XMM0_Dc_01;
    uStack_ac = extraout_XMM0_Dd_01;
    local_c8 = cosf(local_168[0]);
    local_108 = sinf(local_108);
    uStack_104 = extraout_XMM0_Db_02;
    uStack_100 = extraout_XMM0_Dc_02;
    uStack_fc = extraout_XMM0_Dd_02;
    local_f8 = sinf(local_d8);
    fVar10 = sinf(local_e8);
    fVar11 = local_158[1];
    fVar19 = local_118 * local_b8;
    fVar13 = local_b8 * local_108;
    fVar12 = local_118 * local_f8 * fVar10 - local_108 * local_c8;
    fVar15 = local_118 * local_c8 + local_108 * local_f8 * fVar10;
    fVar24 = local_b8 * fVar10;
    fVar17 = local_108 * fVar10 + local_c8 * local_118 * local_f8;
    local_78 = local_c8 * local_108 * local_f8 - local_118 * fVar10;
    local_b8 = local_b8 * local_c8;
    fVar20 = (fVar19 * local_158[0] + fVar13 * local_158[4]) - local_f8 * (float)uStack_138;
    fVar21 = (fVar19 * local_158[1] + fVar13 * local_158[5]) - local_f8 * uStack_138._4_4_;
    fVar22 = (fVar19 * local_158[2] + fVar13 * local_158[6]) - local_f8 * local_130;
    fStack_e4 = (fVar19 * local_158[3] + fVar13 * local_158[7]) - local_f8 * (float)local_12c;
    local_c8 = (float)uStack_138;
    fStack_c4 = uStack_138._4_4_;
    fStack_c0 = local_130;
    fStack_bc = (float)local_12c;
    fVar25 = fVar24 * (float)uStack_138 + fVar12 * local_158[0] + fVar15 * local_158[4];
    local_a8 = fVar24 * uStack_138._4_4_ + fVar12 * local_158[1] + fVar15 * local_158[5];
    fVar26 = fVar24 * local_130 + fVar12 * local_158[2] + fVar15 * local_158[6];
    fStack_54 = fVar24 * (float)local_12c + fVar12 * local_158[3] + fVar15 * local_158[7];
    local_108 = fVar17;
    local_d8 = local_158[0];
    fStack_d4 = local_158[1];
    fStack_d0 = local_158[2];
    fStack_cc = local_158[3];
    fVar14 = local_b8 * (float)uStack_138 + fVar17 * local_158[0] + local_78 * local_158[4];
    local_88 = local_b8 * uStack_138._4_4_ + fVar17 * local_158[1] + local_78 * local_158[5];
    fVar16 = local_130 * local_b8 + local_158[2] * fVar17 + local_158[6] * local_78;
    local_78 = local_158[7] * local_78;
    fStack_74 = local_158[7];
    fStack_70 = local_158[7];
    fStack_6c = local_158[7];
    fVar10 = M->x[0][2];
    fVar12 = M->x[1][2];
    fVar13 = M->x[2][2];
    local_e8 = fStack_e4 * 0.0 + fVar22 * fVar13 + fVar20 * fVar10 + fVar21 * fVar12;
    fStack_e0 = fStack_e4;
    fStack_dc = fStack_e4;
    fStack_a4 = local_a8;
    fStack_a0 = local_a8;
    fStack_9c = local_a8;
    local_68 = ZEXT416((uint)fVar13);
    local_58 = fStack_54 * 0.0 + fVar26 * fVar13 + fVar25 * fVar10 + local_a8 * fVar12;
    fStack_50 = fStack_54;
    fStack_4c = fStack_54;
    fStack_84 = local_88;
    fStack_80 = local_88;
    fStack_7c = local_88;
    local_f8 = fVar16 * fVar13 + fVar10 * fVar14 + fVar12 * local_88;
    fStack_f4 = (float)local_12c;
    fStack_f0 = local_130;
    fStack_ec = (float)local_12c;
    local_48 = fVar16 * 0.0 + fVar14 * 0.0 + local_88 * 0.0;
    fStack_44 = (float)local_12c;
    fStack_40 = local_130;
    fStack_3c = (float)local_12c;
    fVar18 = (float)uStack_124 * 0.0;
    fVar27 = local_12c._4_4_ * 0.0;
    fVar23 = uStack_124._4_4_ * 0.0;
    uVar1 = *(undefined8 *)M->x[1];
    fVar28 = (float)uVar1;
    fVar30 = (float)((ulong)uVar1 >> 0x20);
    uVar1 = *(undefined8 *)M->x[0];
    fVar10 = (float)uVar1;
    fVar15 = (float)((ulong)uVar1 >> 0x20);
    local_98 = *(undefined8 *)M->x[2];
    fVar19 = (float)local_98;
    fVar24 = (float)((ulong)local_98 >> 0x20);
    uStack_90 = 0;
    local_118 = fStack_e4 * 0.0 + fVar22 * fVar19 + fVar20 * fVar10 + fVar21 * fVar28;
    fStack_114 = fStack_e4 * 0.0 + fVar22 * fVar24 + fVar20 * fVar15 + fVar21 * fVar30;
    fStack_110 = fStack_e4 * 0.0 + fStack_e4 * 0.0 + fVar21 * 0.0 + fVar21 * 0.0;
    fStack_10c = fStack_e4 * 0.0 + fStack_e4 * 0.0 + fVar21 * 0.0 + fVar21 * 0.0;
    fVar29 = fVar28 * (float)uStack_124;
    uVar1 = *(undefined8 *)(M->x[1] + 1);
    uVar2 = *(undefined8 *)(M->x[0] + 1);
    local_158[0] = local_118;
    local_158[1] = fStack_114;
    local_158[2] = local_e8;
    local_158[3] = fVar22 * 0.0 + fVar20 * 0.0 + fVar21 * 0.0 + fStack_e4;
    local_158[4] = fStack_54 * 0.0 + fVar26 * fVar19 + fVar25 * fVar10 + local_a8 * fVar28;
    local_158[5] = fStack_54 * 0.0 + fVar26 * fVar24 + fVar25 * fVar15 + local_a8 * fVar30;
    local_158[7] = fVar26 * 0.0 + fVar25 * 0.0 + local_a8 * 0.0 + fStack_54;
    local_158[6] = local_58;
    fVar20 = fVar19 * uStack_124._4_4_;
    fVar11 = local_b8 * uStack_138._4_4_ + fVar17 * fVar11 + local_78;
    fVar12 = fVar11 * 0.0;
    uStack_138 = CONCAT44(fVar12 + fVar16 * fVar24 + fVar14 * fVar15 + local_88 * fVar30,
                          fVar12 + fVar16 * fVar19 + fVar14 * fVar10 + local_88 * fVar28);
    local_130 = local_f8 + fVar12;
    uStack_124 = CONCAT44(local_11c * 0.0 +
                          fVar13 * uStack_124._4_4_ +
                          local_12c._4_4_ * (float)((ulong)uVar2 >> 0x20) +
                          (float)uStack_124 * (float)((ulong)uVar1 >> 0x20),
                          local_11c * 0.0 +
                          fVar24 * uStack_124._4_4_ +
                          local_12c._4_4_ * (float)uVar2 + (float)uStack_124 * (float)uVar1);
    local_12c = CONCAT44(local_11c * 0.0 + fVar20 + local_12c._4_4_ * fVar10 + fVar29,
                         local_48 + fVar11);
    local_11c = fVar23 + fVar27 + fVar18 + local_11c;
    fVar10 = *(float *)((long)local_158 + uVar6 + lVar9 * 0x10);
    fVar12 = *(float *)((long)local_158 + uVar6 + lVar8 * 0x10);
    fVar10 = fVar10 * fVar10 + fVar12 * fVar12;
    if (fVar10 < 0.0) {
      fVar10 = sqrtf(fVar10);
    }
    else {
      fVar10 = SQRT(fVar10);
    }
    fVar10 = atan2f(fVar10,*(float *)((long)local_158 + (ulong)uVar7 * 4 + (ulong)(uVar7 << 4)));
    (this->super_Vec3<float>).y = fVar10;
    fVar12 = local_158[lVar9 * 4 + lVar8];
    fVar10 = local_158[lVar9 * 5];
  }
  fVar10 = atan2f(fVar12,fVar10);
  (this->super_Vec3<float>).z = fVar10;
  bVar3 = this->field_0xc;
  if ((bVar3 & 4) == 0) {
    uVar6._0_4_ = (this->super_Vec3<float>).x;
    uVar6._4_4_ = (this->super_Vec3<float>).y;
    (this->super_Vec3<float>).x = (float)(int)(uVar6 ^ 0x8000000080000000);
    (this->super_Vec3<float>).y = (float)(int)((uVar6 ^ 0x8000000080000000) >> 0x20);
    (this->super_Vec3<float>).z = -(this->super_Vec3<float>).z;
  }
  if ((bVar3 & 1) == 0) {
    fVar10 = (this->super_Vec3<float>).x;
    (this->super_Vec3<float>).x = (this->super_Vec3<float>).z;
    (this->super_Vec3<float>).z = fVar10;
  }
  return;
}

Assistant:

IMATH_HOSTDEVICE void
Euler<T>::extract (const Matrix33<T>& M) IMATH_NOEXCEPT
{
    int i, j, k;
    angleOrder (i, j, k);

    if (_initialRepeated)
    {
        //
        // Extract the first angle, x.
        //

        x = std::atan2 (M[j][i], M[k][i]);

        //
        // Remove the x rotation from M, so that the remaining
        // rotation, N, is only around two axes, and gimbal lock
        // cannot occur.
        //

        Vec3<T> r (0, 0, 0);
        r[i] = (_parityEven ? -x : x);

        Matrix44<T> N;
        N.rotate (r);

        N = N * Matrix44<T> (
                    M[0][0],
                    M[0][1],
                    M[0][2],
                    0,
                    M[1][0],
                    M[1][1],
                    M[1][2],
                    0,
                    M[2][0],
                    M[2][1],
                    M[2][2],
                    0,
                    0,
                    0,
                    0,
                    1);
        //
        // Extract the other two angles, y and z, from N.
        //

        T sy = std::sqrt (N[j][i] * N[j][i] + N[k][i] * N[k][i]);
        y    = std::atan2 (sy, N[i][i]);
        z    = std::atan2 (N[j][k], N[j][j]);
    }
    else
    {
        //
        // Extract the first angle, x.
        //

        x = std::atan2 (M[j][k], M[k][k]);

        //
        // Remove the x rotation from M, so that the remaining
        // rotation, N, is only around two axes, and gimbal lock
        // cannot occur.
        //

        Vec3<T> r (0, 0, 0);
        r[i] = (_parityEven ? -x : x);

        Matrix44<T> N;
        N.rotate (r);

        N = N * Matrix44<T> (
                    M[0][0],
                    M[0][1],
                    M[0][2],
                    0,
                    M[1][0],
                    M[1][1],
                    M[1][2],
                    0,
                    M[2][0],
                    M[2][1],
                    M[2][2],
                    0,
                    0,
                    0,
                    0,
                    1);
        //
        // Extract the other two angles, y and z, from N.
        //

        T cy = std::sqrt (N[i][i] * N[i][i] + N[i][j] * N[i][j]);
        y    = std::atan2 (-N[i][k], cy);
        z    = std::atan2 (-N[j][i], N[j][j]);
    }

    if (!_parityEven) *this *= -1;

    if (!_frameStatic)
    {
        T t = x;
        x   = z;
        z   = t;
    }
}